

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86::forward_fp16s
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  Option opt_flatten;
  void *local_a0;
  int *local_98;
  size_t local_90;
  int local_88;
  Allocator *local_80;
  int local_78;
  int local_74;
  undefined8 local_70;
  int local_68;
  size_t local_60;
  undefined4 local_58;
  int iStack_54;
  Allocator *pAStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  int local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_78 = bottom_blob->dims;
  if (local_78 == 2) {
    iVar2 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86[-3]) /
            *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]);
    local_74 = bottom_blob->w;
    if (bottom_blob->w == iVar2) {
      local_74 = iVar2;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]),
                    bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        return 0;
      }
    }
  }
  else {
    local_74 = bottom_blob->w;
  }
  local_a0 = bottom_blob->data;
  local_98 = bottom_blob->refcount;
  local_90 = bottom_blob->elemsize;
  local_88 = bottom_blob->elempack;
  local_80 = bottom_blob->allocator;
  local_70._0_4_ = bottom_blob->h;
  local_70._4_4_ = bottom_blob->d;
  local_68 = bottom_blob->c;
  local_60 = bottom_blob->cstep;
  iVar2 = local_78;
  if (local_98 != (int *)0x0) {
    LOCK();
    *local_98 = *local_98 + 1;
    UNLOCK();
    iVar2 = bottom_blob->dims;
  }
  if (iVar2 != 1) {
    local_58 = *(undefined4 *)opt;
    iStack_54 = opt->num_threads;
    local_48 = *(undefined4 *)&opt->workspace_allocator;
    uStack_44 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    iStack_40 = opt->openmp_blocktime;
    uStack_3c._0_1_ = opt->use_winograd_convolution;
    uStack_3c._1_1_ = opt->use_sgemm_convolution;
    uStack_3c._2_1_ = opt->use_int8_inference;
    uStack_3c._3_1_ = opt->use_vulkan_compute;
    local_38._0_1_ = opt->use_bf16_storage;
    local_38._1_1_ = opt->use_fp16_packed;
    local_38._2_1_ = opt->use_fp16_storage;
    local_38._3_1_ = opt->use_fp16_arithmetic;
    uStack_34._0_1_ = opt->use_int8_packed;
    uStack_34._1_1_ = opt->use_int8_storage;
    uStack_34._2_1_ = opt->use_int8_arithmetic;
    uStack_34._3_1_ = opt->use_packing_layout;
    uStack_30._0_1_ = opt->use_shader_pack8;
    uStack_30._1_1_ = opt->use_subgroup_basic;
    uStack_30._2_1_ = opt->use_subgroup_vote;
    uStack_30._3_1_ = opt->use_subgroup_ballot;
    uStack_2c._0_1_ = opt->use_subgroup_shuffle;
    uStack_2c._1_1_ = opt->use_image_storage;
    uStack_2c._2_1_ = opt->use_tensor_storage;
    uStack_2c._3_1_ = opt->use_reserved_0;
    local_28 = opt->flush_denormals;
    uStack_24._0_1_ = opt->use_local_pool_allocator;
    uStack_24._1_1_ = opt->use_shader_local_memory;
    uStack_24._2_1_ = opt->use_cooperative_matrix;
    uStack_24._3_1_ = opt->use_winograd23_convolution;
    uStack_20._0_1_ = opt->use_winograd43_convolution;
    uStack_20._1_1_ = opt->use_winograd63_convolution;
    uStack_20._2_1_ = opt->use_reserved_6;
    uStack_20._3_1_ = opt->use_reserved_7;
    uStack_1c._0_1_ = opt->use_reserved_8;
    uStack_1c._1_1_ = opt->use_reserved_9;
    uStack_1c._2_1_ = opt->use_reserved_10;
    uStack_1c._3_1_ = opt->use_reserved_11;
    pAStack_50 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_a0);
  }
  uVar1 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]);
  lVar3 = 1;
  if (opt->use_packing_layout == true) {
    lVar3 = 8;
    if ((uVar1 & 7) != 0) {
      lVar3 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar1 / (int)lVar3,lVar3 * (local_90 / (ulong)(long)local_88),(int)lVar3
              ,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    iVar2 = -100;
  }
  else {
    iVar2 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar2 = 0;
    }
  }
  if (local_98 != (int *)0x0) {
    LOCK();
    *local_98 = *local_98 + -1;
    UNLOCK();
    if (*local_98 == 0) {
      if (local_80 == (Allocator *)0x0) {
        if (local_a0 != (void *)0x0) {
          free(local_a0);
        }
      }
      else {
        (*local_80->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int InnerProduct_x86::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}